

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getDataHome.cpp
# Opt level: O0

int main(void)

{
  string local_30;
  undefined4 local_c;
  
  local_c = 0;
  sago::getDataHome_abi_cxx11_();
  run_test(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int main() {
	run_test(sago::getDataHome());
	return 0;
}